

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntervalScheduling.cpp
# Opt level: O3

void __thiscall WeightedInterval::WeightedInterval(WeightedInterval *this,int s,int e,double sc)

{
  int iVar1;
  
  iVar1 = e;
  if (s < e) {
    iVar1 = s;
  }
  if (e < s) {
    e = s;
  }
  this->start = iVar1;
  this->end = e;
  this->score = sc;
  return;
}

Assistant:

WeightedInterval::WeightedInterval(int s, int e, double sc) {
    if (s < e) {
        start = s;
        end = e;
    } else {
        start = e;
        end = s;
    }
    score = sc;
}